

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashQLookup(void)

{
  int iVar1;
  int iVar2;
  xmlHashTablePtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  void *val_02;
  int local_44;
  int n_name;
  xmlChar *name;
  int n_prefix;
  xmlChar *prefix;
  int n_hash;
  xmlHashTablePtr hash;
  void *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (prefix._4_4_ = 0; (int)prefix._4_4_ < 2; prefix._4_4_ = prefix._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlHashTablePtr(prefix._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(name._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        val_02 = (void *)xmlHashQLookup(val,val_00,val_01);
        desret_void_ptr(val_02);
        call_tests = call_tests + 1;
        des_xmlHashTablePtr(prefix._4_4_,val,0);
        des_const_xmlChar_ptr(name._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashQLookup",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)prefix._4_4_);
          printf(" %d",(ulong)name._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlHashQLookup(void) {
    int test_ret = 0;

    int mem_base;
    void * ret_val;
    xmlHashTablePtr hash; /* hash table */
    int n_hash;
    const xmlChar * prefix; /* prefix of the string key */
    int n_prefix;
    const xmlChar * name; /* local name of the string key */
    int n_name;

    for (n_hash = 0;n_hash < gen_nb_xmlHashTablePtr;n_hash++) {
    for (n_prefix = 0;n_prefix < gen_nb_const_xmlChar_ptr;n_prefix++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
        mem_base = xmlMemBlocks();
        hash = gen_xmlHashTablePtr(n_hash, 0);
        prefix = gen_const_xmlChar_ptr(n_prefix, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);

        ret_val = xmlHashQLookup(hash, prefix, name);
        desret_void_ptr(ret_val);
        call_tests++;
        des_xmlHashTablePtr(n_hash, hash, 0);
        des_const_xmlChar_ptr(n_prefix, prefix, 1);
        des_const_xmlChar_ptr(n_name, name, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashQLookup",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_hash);
            printf(" %d", n_prefix);
            printf(" %d", n_name);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}